

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Psbt::GetGlobalXpubkeyDataList
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Psbt *this)

{
  pointer __n;
  CfdException *this_00;
  long *plVar1;
  KeyData local_2c8;
  uint32_t *local_178;
  size_t arr_index;
  uint32_t *val_arr;
  size_t arr_max;
  undefined1 local_148 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData fingerprint;
  ExtPubkey ext_pubkey;
  ByteData key;
  size_t key_index;
  wally_map_item *item;
  size_t key_max;
  allocator local_59;
  string local_58;
  CfdSourceLocation local_38;
  void *local_20;
  wally_psbt *psbt_pointer;
  Psbt *this_local;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *arr;
  
  local_20 = this->wally_psbt_pointer_;
  psbt_pointer = (wally_psbt *)this;
  this_local = (Psbt *)__return_storage_ptr__;
  if (local_20 == (void *)0x0) {
    local_38.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_38.filename = local_38.filename + 1;
    local_38.line = 0xc9f;
    local_38.funcname = "GetGlobalXpubkeyDataList";
    logger::warn<>(&local_38,"psbt pointer is null");
    this_00 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_58,"psbt pointer is null.",&local_59);
    CfdException::CfdException(this_00,kCfdIllegalStateError,&local_58);
    __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
  }
  __n = *(pointer *)((long)local_20 + 0x48);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            (__return_storage_ptr__);
  ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
            (__return_storage_ptr__,(size_type)__n);
  for (key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage < __n;
      key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           key.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 1) {
    plVar1 = (long *)(*(long *)((long)local_20 + 0x40) +
                     (long)key.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage * 0x20);
    if ((plVar1[1] == 0x4f) && (*(char *)*plVar1 == '\x01')) {
      ByteData::ByteData((ByteData *)
                         &ext_pubkey.tweak_sum_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,(uint8_t *)(*plVar1 + 1),
                         (int)plVar1[1] - 1);
      ExtPubkey::ExtPubkey
                ((ExtPubkey *)
                 &fingerprint.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (ByteData *)
                 &ext_pubkey.tweak_sum_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ByteData::ByteData((ByteData *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
      if (((plVar1[3] & 3U) == 0) && (plVar1[3] != 0)) {
        ByteData::ByteData((ByteData *)&arr_max,(uint8_t *)plVar1[2],4);
        ByteData::operator=((ByteData *)
                            &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage,(ByteData *)&arr_max)
        ;
        ByteData::~ByteData((ByteData *)&arr_max);
        val_arr = (uint32_t *)((ulong)plVar1[3] >> 2);
        arr_index = plVar1[2];
        for (local_178 = (uint32_t *)0x1; local_178 < val_arr;
            local_178 = (uint32_t *)((long)local_178 + 1)) {
          ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,
                     (value_type_conflict1 *)(arr_index + (long)local_178 * 4));
        }
      }
      KeyData::KeyData(&local_2c8,
                       (ExtPubkey *)
                       &fingerprint.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148,
                       (ByteData *)
                       &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
      ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
      emplace_back<cfd::core::KeyData>(__return_storage_ptr__,&local_2c8);
      KeyData::~KeyData(&local_2c8);
      ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_148);
      ByteData::~ByteData((ByteData *)
                          &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      ExtPubkey::~ExtPubkey
                ((ExtPubkey *)
                 &fingerprint.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      ByteData::~ByteData((ByteData *)
                          &ext_pubkey.tweak_sum_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<KeyData> Psbt::GetGlobalXpubkeyDataList() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  size_t key_max = psbt_pointer->unknowns.num_items;
  std::vector<KeyData> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->unknowns.items[key_index];
    if (item->key_len != kPsbtGlobalXpubSize) continue;
    if (item->key[0] != Psbt::kPsbtGlobalXpub) continue;
    ByteData key(&item->key[1], static_cast<uint32_t>(item->key_len) - 1);
    ExtPubkey ext_pubkey(key);

    ByteData fingerprint;
    std::vector<uint32_t> path;
    if (((item->value_len % 4) == 0) && (item->value_len > 0)) {
      fingerprint = ByteData(item->value, 4);

      // TODO(k-matsuzawa) Need endian support.
      size_t arr_max = item->value_len / 4;
      uint32_t *val_arr = reinterpret_cast<uint32_t *>(item->value);
      for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
        path.push_back(val_arr[arr_index]);
      }
    }
    arr.emplace_back(KeyData(ext_pubkey, path, fingerprint));
  }
  return arr;
}